

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# for_each.cpp
# Opt level: O0

void for_each_test(void)

{
  value_printer vVar1;
  int local_58 [4];
  base10 local_48;
  int local_44;
  int local_40;
  value_printer vStack_3c;
  int base10_result;
  value_printer local_34;
  value_printer local_28;
  value_printer local_20;
  value_printer r2;
  int local_10;
  int iStack_c;
  value_printer r;
  
  value_printer::value_printer(&r2);
  vVar1 = brigand::for_each<brigand::list<char,short,int,double>,value_printer>(r2);
  iStack_c = vVar1.res;
  if (iStack_c != 0x40) {
    __assert_fail("r.res == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/for_each.cpp"
                  ,0x39,"void for_each_test()");
  }
  local_10 = vVar1.i;
  if (local_10 != 4) {
    __assert_fail("r.i == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/for_each.cpp"
                  ,0x3a,"void for_each_test()");
  }
  value_printer::value_printer(&local_28);
  local_20 = brigand::for_each<custom_list<char,short,int,double>,value_printer>(local_28);
  if (local_20.res != 0x40) {
    __assert_fail("r2.res == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/for_each.cpp"
                  ,0x3e,"void for_each_test()");
  }
  if (local_20.i == 4) {
    brigand::for_each<brigand::list<char,void,int,double>,evil>();
    value_printer::value_printer(&stack0xffffffffffffffc4);
    local_34 = brigand::for_each<brigand::list<evil,evil,evil>,value_printer>(vStack_3c);
    iStack_c = local_34.res;
    if (iStack_c != 1) {
      __assert_fail("r.res == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/for_each.cpp"
                    ,0x45,"void for_each_test()");
    }
    local_10 = local_34.i;
    if (local_10 == 3) {
      memset(&local_48,0,4);
      base10::base10(&local_48);
      local_58[3] = 1;
      local_58[2] = 2;
      local_58[1] = 3;
      local_58[0] = 4;
      local_44 = (int)brigand::for_each_args<base10,int,int,int,int>
                                (local_48,local_58 + 3,local_58 + 2,local_58 + 1,local_58);
      if (local_44 == 0x4d2) {
        return;
      }
      local_40 = local_44;
      __assert_fail("base10_result == 1234",
                    "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/for_each.cpp"
                    ,0x4a,"void for_each_test()");
    }
    __assert_fail("r.i == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/for_each.cpp"
                  ,0x46,"void for_each_test()");
  }
  __assert_fail("r2.i == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/for_each.cpp"
                ,0x3f,"void for_each_test()");
}

Assistant:

void for_each_test()
{
    // test regular cases
    auto r = brigand::for_each<brigand::list<char, short, int, double>>(value_printer{});
    assert(r.res == 64);
    assert(r.i == 4);

    // test with custom list
    auto r2 = brigand::for_each<custom_list<char, short, int, double>>(value_printer{});
    assert(r2.res == 64);
    assert(r2.i == 4);

    // test issues with comma operator
    brigand::for_each<brigand::list<char, void, int, double>>(evil{});

    r = brigand::for_each<brigand::list<evil, evil, evil>>(value_printer{});
    assert(r.res == 1);
    assert(r.i == 3);

    // Test for_each_args separately
    auto base10_result = brigand::for_each_args(base10{}, 1, 2, 3, 4).result;
    assert(base10_result == 1234);
}